

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# structurally_valid.cc
# Opt level: O1

char * __thiscall
google::protobuf::internal::UTF8CoerceToStructurallyValid
          (internal *this,StringPiece src_str,char *idst,char replace_char)

{
  char cVar1;
  int iVar2;
  ulong uVar3;
  internal *piVar4;
  int str_length;
  size_t sVar5;
  internal *piVar6;
  int bytes_consumed;
  uint local_44;
  internal *local_40;
  int local_34;
  
  cVar1 = (anonymous_namespace)::module_initialized_;
  piVar6 = (internal *)src_str.length_;
  str_length = (int)src_str.ptr_;
  iVar2 = str_length;
  if ((anonymous_namespace)::module_initialized_ == '\x01') {
    local_34 = 0;
    UTF8GenericScanFastAscii
              ((UTF8ScanObj *)utf8acceptnonsurrogates_obj,(char *)this,str_length,&local_34);
    iVar2 = local_34;
  }
  local_40 = this;
  if (iVar2 != str_length) {
    sVar5 = (size_t)iVar2;
    memmove(piVar6,this,sVar5);
    local_40 = piVar6;
    if ((long)sVar5 < (long)str_length) {
      piVar4 = this + sVar5;
      piVar6 = piVar6 + sVar5;
      do {
        *piVar6 = SUB81(idst,0);
        piVar4 = piVar4 + 1;
        uVar3 = (long)(this + str_length) - (long)piVar4;
        if ((long)uVar3 < 0) {
          __assert_fail("len >= 0",
                        "src/../third_party/protobuf-lite/google/protobuf/stubs/stringpiece.h",0xe5,
                        "google::protobuf::StringPiece::StringPiece(const char *, stringpiece_ssize_type)"
                       );
        }
        if (cVar1 != '\0') {
          local_44 = 0;
          UTF8GenericScanFastAscii
                    ((UTF8ScanObj *)utf8acceptnonsurrogates_obj,(char *)piVar4,(int)uVar3,
                     (int *)&local_44);
          uVar3 = (ulong)local_44;
        }
        sVar5 = (size_t)(int)uVar3;
        memmove(piVar6 + 1,piVar4,sVar5);
        piVar4 = piVar4 + sVar5;
        piVar6 = piVar6 + 1 + sVar5;
      } while (piVar4 < this + str_length);
    }
  }
  return (char *)local_40;
}

Assistant:

char* UTF8CoerceToStructurallyValid(StringPiece src_str, char* idst,
                                    const char replace_char) {
  const char* isrc = src_str.data();
  const int len = src_str.length();
  int n = UTF8SpnStructurallyValid(src_str);
  if (n == len) {               // Normal case -- all is cool, return
    return const_cast<char*>(isrc);
  } else {                      // Unusual case -- copy w/o bad bytes
    const char* src = isrc;
    const char* srclimit = isrc + len;
    char* dst = idst;
    memmove(dst, src, n);       // Copy initial good chunk
    src += n;
    dst += n;
    while (src < srclimit) {    // src points to bogus byte or is off the end
      dst[0] = replace_char;                    // replace one bad byte
      src++;
      dst++;
      StringPiece str2(src, srclimit - src);
      n = UTF8SpnStructurallyValid(str2);       // scan the remainder
      memmove(dst, src, n);                     // copy next good chunk
      src += n;
      dst += n;
    }
  }
  return idst;
}